

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O1

int cfg_schema_handle_db_startup_changes(cfg_db *post_db)

{
  int iVar1;
  cfg_db *pre_change;
  
  pre_change = cfg_db_add();
  if (pre_change == (cfg_db *)0x0) {
    iVar1 = -1;
  }
  else {
    pre_change->schema = post_db->schema;
    iVar1 = _handle_db_changes(pre_change,post_db,true);
    cfg_db_remove(pre_change);
  }
  return iVar1;
}

Assistant:

int
cfg_schema_handle_db_startup_changes(struct cfg_db *post_db) {
  struct cfg_db *pre_db;
  int result;

  pre_db = cfg_db_add();
  if (pre_db == NULL) {
    return -1;
  }
  cfg_db_link_schema(pre_db, post_db->schema);

  result = _handle_db_changes(pre_db, post_db, true);
  cfg_db_remove(pre_db);
  return result;
}